

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::texcoord3f> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::texcoord3f>
          (optional<tinyusdz::value::texcoord3f> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::value::texcoord3f> local_28;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<tinyusdz::value::texcoord3f>(&local_28,&this->_var);
  nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::
  optional<tinyusdz::value::texcoord3f,_0>(__return_storage_ptr__,&local_28);
  nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::~optional(&local_28);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }